

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu.cpp
# Opt level: O0

int __thiscall ncnn::ReLU::forward_inplace(ReLU *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  int i_1;
  float *ptr_1;
  int q_1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  undefined8 in_stack_fffffffffffffef0;
  Mat *this_00;
  Mat *in_stack_fffffffffffffef8;
  int local_e4;
  Mat local_e0;
  Option *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int iVar2;
  undefined4 in_stack_ffffffffffffff74;
  Mat local_80;
  float *local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  if (*(long *)(in_RSI + 0x10) == 1) {
    local_4 = forward_inplace_int8
                        ((ReLU *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (Mat *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         in_stack_ffffffffffffff60);
  }
  else {
    local_24 = *(int *)(in_RSI + 0x2c);
    local_28 = *(int *)(in_RSI + 0x30);
    local_2c = *(int *)(in_RSI + 0x34);
    local_30 = local_24 * local_28;
    if ((*(float *)(in_RDI + 0x80) != 0.0) || (NAN(*(float *)(in_RDI + 0x80)))) {
      for (iVar2 = 0; iVar2 < local_2c; iVar2 = iVar2 + 1) {
        this_00 = &local_e0;
        Mat::channel(in_stack_fffffffffffffef8,(int)((ulong)this_00 >> 0x20));
        in_stack_fffffffffffffef8 = (Mat *)Mat::operator_cast_to_float_(this_00);
        Mat::~Mat((Mat *)0x156055);
        for (local_e4 = 0; local_e4 < local_30; local_e4 = local_e4 + 1) {
          pfVar1 = (float *)((long)&in_stack_fffffffffffffef8->data + (long)local_e4 * 4);
          if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
            *(float *)((long)&in_stack_fffffffffffffef8->data + (long)local_e4 * 4) =
                 *(float *)(in_RDI + 0x80) *
                 *(float *)((long)&in_stack_fffffffffffffef8->data + (long)local_e4 * 4);
          }
        }
      }
    }
    else {
      for (local_34 = 0; local_34 < local_2c; local_34 = local_34 + 1) {
        Mat::channel(in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
        pfVar1 = Mat::operator_cast_to_float_(&local_80);
        Mat::~Mat((Mat *)0x155f4a);
        for (iVar2 = 0; iVar2 < local_30; iVar2 = iVar2 + 1) {
          if (pfVar1[iVar2] <= 0.0 && pfVar1[iVar2] != 0.0) {
            pfVar1[iVar2] = 0.0;
          }
        }
        local_40 = pfVar1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ReLU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (bottom_top_blob.elemsize == 1u)
        return ReLU::forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}